

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

int INTEGER__compar_value2enum(void *kp,void *am)

{
  long b;
  asn_INTEGER_enum_map_t *el;
  long a;
  void *am_local;
  void *kp_local;
  undefined4 local_4;
  
  if (*kp < *am) {
    local_4 = -1;
  }
  else if (*kp == *am) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
INTEGER__compar_value2enum(const void *kp, const void *am) {
	long a = *(const long *)kp;
	const asn_INTEGER_enum_map_t *el = (const asn_INTEGER_enum_map_t *)am;
	long b = el->nat_value;
	if(a < b) return -1;
	else if(a == b) return 0;
	else return 1;
}